

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

void baryonyx::convert<baryonyx::itm::minimize_tag>
               (raw_result<baryonyx::itm::minimize_tag> *source,solution *sol,int variables)

{
  int iVar1;
  ulong uVar2;
  
  sol->value = source->value;
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(&sol->variables,(long)variables);
  for (uVar2 = 0; (uint)variables != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = bit_array::operator[](&source->x,(int)uVar2);
    (sol->variables).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] = (char)iVar1;
  }
  return;
}

Assistant:

void
convert(const raw_result<Mode>& source, solution& sol, int variables)
{
    sol.value = source.value;
    sol.variables.resize(variables);

    for (int i = 0; i != variables; ++i)
        sol.variables[i] = static_cast<var_value>(source.x[i]);
}